

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.hpp
# Opt level: O2

void rsg::(anonymous_namespace)::convertValueRangeTempl<int,int>
               (ConstValueRangeAccess src,ValueRangeAccess dst)

{
  Scalar SVar1;
  
  SVar1 = *src.m_max;
  *dst.super_ConstValueRangeAccess.m_min = *src.m_min;
  *dst.super_ConstValueRangeAccess.m_max = SVar1;
  return;
}

Assistant:

ConstValueAccess			getMax					(void) const	{ return ConstValueAccess(*m_type, m_max);	}